

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderQuads.cpp
# Opt level: O3

void __thiscall
glcts::TessellationShaderQuadsDegenerateCase::initTest(TessellationShaderQuadsDegenerateCase *this)

{
  _tessellation_shader_vertex_spacing vertex_spacing;
  long lVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  GLenum GVar5;
  int iVar6;
  undefined4 extraout_var;
  TessellationShaderUtils *this_00;
  long lVar7;
  NotSupportedError *this_01;
  TestError *this_02;
  _tessellation_shader_vertex_spacing vertex_spacing_00;
  long lVar8;
  value_type local_238;
  string vs_mode_string;
  GLint tess_levels [3];
  GLint gl_max_tess_gen_level_value;
  undefined1 local_1b8 [8];
  _func_int **pp_Stack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [6];
  ios_base local_140 [272];
  Functions *gl;
  
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == false) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_1b8 = (undefined1  [8])local_1a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,"Tessellation shader functionality not supported, skipping","");
    tcu::NotSupportedError::NotSupportedError(this_01,(string *)local_1b8);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar4 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar4);
  this_00 = (TessellationShaderUtils *)operator_new(0x20);
  TessellationShaderUtils::TessellationShaderUtils(this_00,gl,&this->super_TestCaseBase);
  this->m_utils = this_00;
  (*gl->genVertexArrays)(1,&this->m_vao_id);
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"Could not generate vertex array object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderQuads.cpp"
                  ,0x73);
  (*gl->bindVertexArray)(this->m_vao_id);
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"Error binding vertex array object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderQuads.cpp"
                  ,0x76);
  gl_max_tess_gen_level_value = 0;
  (*gl->getIntegerv)((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_GEN_LEVEL,
                     &gl_max_tess_gen_level_value);
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"glGetIntegerv() call failed for GL_MAX_TESS_GEN_LEVEL_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderQuads.cpp"
                  ,0x7c);
  tess_levels[0] = -gl_max_tess_gen_level_value - (-gl_max_tess_gen_level_value >> 0x1f) >> 1;
  tess_levels[1] = -1;
  tess_levels[2] = 1;
  lVar7 = 0;
  bVar3 = false;
  do {
    vertex_spacing = (&DAT_01b6a0a4)[lVar7];
    lVar8 = 0;
    do {
      iVar4 = tess_levels[lVar8];
      local_238.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage._0_4_ = 0;
      local_238.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage._4_4_ = 0;
      local_238.n_vertices = 0;
      local_238.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)0x0;
      local_238.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_finish._0_4_ = 0;
      local_238.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_finish._4_4_ = 0;
      iVar6 = iVar4;
      if (iVar4 < 0) {
        iVar6 = 1;
      }
      local_238.inner[0] = (float)iVar4;
      local_238.outer[2] = (float)iVar6;
      local_238.vertex_spacing = vertex_spacing;
      local_238.inner[1] = local_238.inner[0];
      local_238.outer[3] = local_238.outer[2];
      local_238.n_vertices =
           TessellationShaderUtils::getAmountOfVerticesGeneratedByTessellator
                     (this->m_utils,TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS,local_238.inner,
                      local_238.outer,vertex_spacing,false);
      if (local_238.n_vertices == 0) {
        TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
                  (&vs_mode_string,(TessellationShaderUtils *)(ulong)vertex_spacing,
                   vertex_spacing_00);
        local_1b8 = (undefined1  [8])
                    ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_1b0,
                   "No vertices were generated by tessellator for: inner tess levels:[",0x42);
        std::ostream::_M_insert<double>((double)local_238.inner[0]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", ",2);
        std::ostream::_M_insert<double>((double)local_238.inner[1]);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_1b0,"], outer tess levels:[",0x16);
        std::ostream::_M_insert<double>((double)local_238.outer[0]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", ",2);
        std::ostream::_M_insert<double>((double)local_238.outer[1]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", ",2);
        std::ostream::_M_insert<double>((double)local_238.outer[2]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", ",2);
        std::ostream::_M_insert<double>((double)local_238.outer[3]);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_1b0,"], primitive mode: quads, vertex spacing: ",0x2a);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_1b0,vs_mode_string._M_dataplus._M_p,
                   vs_mode_string._M_string_length);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
        std::ios_base::~ios_base(local_140);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vs_mode_string._M_dataplus._M_p != &vs_mode_string.field_2) {
          operator_delete(vs_mode_string._M_dataplus._M_p,
                          vs_mode_string.field_2._M_allocated_capacity + 1);
        }
        bVar3 = true;
      }
      else {
        TessellationShaderUtils::getDataGeneratedByTessellator
                  ((vector<char,_std::allocator<char>_> *)local_1b8,this->m_utils,local_238.inner,
                   false,TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS,
                   TESSELLATION_SHADER_VERTEX_ORDERING_CCW,local_238.vertex_spacing,local_238.outer)
        ;
        pcVar2 = local_238.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar1 = CONCAT44(local_238.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_,
                         local_238.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._0_4_);
        local_238.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_1b8;
        local_238.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = SUB84(pp_Stack_1b0,0);
        local_238.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ = (undefined4)((ulong)pp_Stack_1b0 >> 0x20);
        local_238.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ =
             (undefined4)local_1a8[0]._M_allocated_capacity;
        local_238.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             (undefined4)((ulong)local_1a8[0]._0_8_ >> 0x20);
        local_1b8 = (undefined1  [8])0x0;
        pp_Stack_1b0 = (_func_int **)0x0;
        local_1a8[0]._M_allocated_capacity = (pointer)0x0;
        if ((TestLog *)pcVar2 != (TestLog *)0x0) {
          operator_delete(pcVar2,lVar1 - (long)pcVar2);
          if (local_1b8 != (undefined1  [8])0x0) {
            operator_delete((void *)local_1b8,local_1a8[0]._M_allocated_capacity - (long)local_1b8);
          }
        }
      }
      std::
      vector<glcts::TessellationShaderQuadsDegenerateCase::_run,_std::allocator<glcts::TessellationShaderQuadsDegenerateCase::_run>_>
      ::push_back(&this->m_runs,&local_238);
      if ((TestLog *)
          local_238.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start != (TestLog *)0x0) {
        operator_delete(local_238.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        CONCAT44(local_238.data.super__Vector_base<char,_std::allocator<char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                 local_238.data.super__Vector_base<char,_std::allocator<char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) -
                        (long)local_238.data.super__Vector_base<char,_std::allocator<char>_>._M_impl
                              .super__Vector_impl_data._M_start);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  if (!bVar3) {
    return;
  }
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_02,
             "Zero vertices were generated by tessellator for at least one run which is not a correct behavior"
             ,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderQuads.cpp"
             ,0xce);
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TessellationShaderQuadsDegenerateCase::initTest()
{
	/* Skip if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Initialize Utils instance */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_utils = new TessellationShaderUtils(gl, this);

	/* Initialize vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Retrieve GL_MAX_TESS_GEN_LEVEL_EXT value */
	glw::GLint gl_max_tess_gen_level_value = 0;

	gl.getIntegerv(m_glExtTokens.MAX_TESS_GEN_LEVEL, &gl_max_tess_gen_level_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call failed for GL_MAX_TESS_GEN_LEVEL_EXT pname");

	/* Initialize all test runs */
	const glw::GLint   tess_levels[] = { -gl_max_tess_gen_level_value / 2, -1, 1 };
	const unsigned int n_tess_levels = sizeof(tess_levels) / sizeof(tess_levels[0]);

	const _tessellation_shader_vertex_spacing vs_modes[] = {
		/* NOTE: We do not check "fractional even" vertex spacing since it will always
		 *       clamp to 2 which is out of scope for this test.
		 */
		TESSELLATION_SHADER_VERTEX_SPACING_DEFAULT,
		TESSELLATION_SHADER_VERTEX_SPACING_EQUAL, TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD
	};
	const unsigned int n_vs_modes = sizeof(vs_modes) / sizeof(vs_modes[0]);

	/* Iterate through all vertex spacing modes */
	bool has_failed = false;

	for (unsigned int n_vs_mode = 0; n_vs_mode < n_vs_modes; ++n_vs_mode)
	{
		_tessellation_shader_vertex_spacing vs_mode = vs_modes[n_vs_mode];

		/* Iterate through all values that should be used for irrelevant tessellation levels */
		for (unsigned int n_tess_level = 0; n_tess_level < n_tess_levels; ++n_tess_level)
		{
			const glw::GLint tess_level = tess_levels[n_tess_level];

			/* Set up the run descriptor.
			 *
			 * Round outer tesellation levels to 1 if necessary, since otherwise no geometry will
			 * be generated.
			 **/
			_run run;

			run.inner[0]	   = (float)tess_level;
			run.inner[1]	   = (float)tess_level;
			run.outer[0]	   = (float)((tess_level < 0) ? 1 : tess_level);
			run.outer[1]	   = (float)((tess_level < 0) ? 1 : tess_level);
			run.outer[2]	   = (float)((tess_level < 0) ? 1 : tess_level);
			run.outer[3]	   = (float)((tess_level < 0) ? 1 : tess_level);
			run.vertex_spacing = vs_mode;

			/* Retrieve vertex data for both passes */
			run.n_vertices = m_utils->getAmountOfVerticesGeneratedByTessellator(
				TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS, run.inner, run.outer, run.vertex_spacing,
				false); /* is_point_mode_enabled */

			if (run.n_vertices == 0)
			{
				std::string vs_mode_string = TessellationShaderUtils::getESTokenForVertexSpacingMode(vs_mode);

				m_testCtx.getLog() << tcu::TestLog::Message << "No vertices were generated by tessellator for: "
															   "inner tess levels:"
															   "["
								   << run.inner[0] << ", " << run.inner[1] << "]"
																			  ", outer tess levels:"
																			  "["
								   << run.outer[0] << ", " << run.outer[1] << ", " << run.outer[2] << ", "
								   << run.outer[3] << "]"
													  ", primitive mode: quads, "
													  "vertex spacing: "
								   << vs_mode_string << tcu::TestLog::EndMessage;

				has_failed = true;
			}
			else
			{
				/* Retrieve the data buffers */
				run.data = m_utils->getDataGeneratedByTessellator(run.inner, false, /* is_point_mode_enabled */
																  TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS,
																  TESSELLATION_SHADER_VERTEX_ORDERING_CCW,
																  run.vertex_spacing, run.outer);
			}

			/* Store the run data */
			m_runs.push_back(run);
		} /* for (all tessellation levels) */
	}	 /* for (all vertex spacing modes) */

	if (has_failed)
	{
		TCU_FAIL("Zero vertices were generated by tessellator for at least one run which is not "
				 "a correct behavior");
	}
}